

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_spec.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  bool bVar1;
  pointer this_00;
  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
  local_30;
  const_iterator itEnd;
  const_iterator it;
  TestCaseInfo *testCase_local;
  TestSpec *this_local;
  
  itEnd = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                    (&this->m_filters);
  local_30._M_current =
       (Filter *)
       std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                 (&this->m_filters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_30);
    if (!bVar1) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
              ::operator->(&itEnd);
    bVar1 = Filter::matches(this_00,testCase);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
    ::operator++(&itEnd);
  }
  return true;
}

Assistant:

bool matches( TestCaseInfo const& testCase ) const {
            // A TestSpec matches if any filter matches
            for( std::vector<Filter>::const_iterator it = m_filters.begin(), itEnd = m_filters.end(); it != itEnd; ++it )
                if( it->matches( testCase ) )
                    return true;
            return false;
        }